

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGParseManager.cpp
# Opt level: O2

void __thiscall BGParseManager::~BGParseManager(BGParseManager *this)

{
  BGParseWorkItem *pBVar1;
  code *pcVar2;
  bool bVar3;
  JobProcessor *pJVar4;
  undefined4 *puVar5;
  Type element;
  
  pJVar4 = JsUtil::JobManager::Processor((JobManager *)this);
  (*pJVar4->_vptr_JobProcessor[1])(pJVar4,this);
  if ((this->workitemsProcessing).head != (Type)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/BGParseManager.cpp"
                       ,0x51,"(this->workitemsProcessing.IsEmpty())",
                       "this->workitemsProcessing.IsEmpty()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  element = (this->workitemsProcessed).head;
  while (element != (BGParseWorkItem *)0x0) {
    pBVar1 = (BGParseWorkItem *)
             (element->super_Job).super_DoublyLinkedListElement<JsUtil::Job,_Memory::ArenaAllocator>
             .next;
    JsUtil::DoublyLinkedList<BGParseWorkItem,_Memory::ArenaAllocator>::Unlink
              (&this->workitemsProcessed,element);
    Memory::DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,BGParseWorkItem>
              (&Memory::HeapAllocator::Instance,element);
    element = pBVar1;
  }
  JsUtil::WaitableJobManager::~WaitableJobManager(&this->super_WaitableJobManager);
  return;
}

Assistant:

BGParseManager::~BGParseManager()
{
    // First, remove the manager from the JobProcessor so that any remaining jobs
    // are moved back into this manager's processed workitem list
    Processor()->RemoveManager(this);

    Assert(this->workitemsProcessing.IsEmpty());

    // Now, free all remaining processed jobs
    BGParseWorkItem *item = (BGParseWorkItem*)this->workitemsProcessed.Head();
    while (item != nullptr)
    {
        // Get the next item first so that the current item
        // can be safely removed and freed
        BGParseWorkItem* temp = item;
        item = (BGParseWorkItem*)item->Next();

        this->workitemsProcessed.Unlink(temp);
        HeapDelete(temp);
    }
}